

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RndFun.cpp
# Opt level: O2

void pad(Sarray *state,int StartIndex)

{
  int iVar1;
  char Input;
  int t;
  int iVar2;
  int iVar3;
  
  iVar1 = BitRate / 8;
  iVar3 = iVar1 - StartIndex;
  if (iVar3 == 1) {
    Input = -0x7a;
  }
  else {
    Absorb('\x06',state,StartIndex);
    for (iVar2 = 1; iVar2 < iVar3 + -1; iVar2 = iVar2 + 1) {
      Absorb('\0',state,StartIndex + iVar2);
    }
    StartIndex = iVar1 + -1;
    Input = -0x80;
  }
  Absorb(Input,state,StartIndex);
  return;
}

Assistant:

void pad(Sarray &state, int StartIndex){
    int toInsert = (BitRate/8)-StartIndex;
    if(toInsert == 1){
        Absorb(0b10000110, state, StartIndex);
    }else{
        Absorb(0b00000110, state, StartIndex);
        for(int t = 1; t < toInsert-1; t++){
            Absorb(0b00000000, state, StartIndex+t);
        }
        Absorb(0b10000000, state, StartIndex+toInsert-1);
    }
}